

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_helpers.hpp
# Opt level: O3

void print_py_error(void)

{
  long lVar1;
  long **pplVar2;
  logger *this;
  object err;
  object sys;
  string err_text;
  logger safe_cout;
  _object *local_d0;
  object_base local_c8;
  object_base local_c0;
  _object *local_b8;
  char *local_b0;
  rvalue_from_python_stage1_data local_a8;
  long *local_98 [2];
  long local_88 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  PyObject *local_50;
  char *local_48;
  logger local_40;
  
  boost::recursive_mutex::recursive_mutex(&local_40.cout_guard);
  PyErr_Print();
  local_b8 = (_object *)PyImport_ImportModule("sys");
  if (local_b8 == (_object *)0x0) {
    boost::python::throw_error_already_set();
  }
  boost::python::api::object::object((object *)&local_c0,(handle *)&local_b8);
  if (local_b8 != (_object *)0x0) {
    if (local_b8->ob_refcnt < 1) {
      __assert_fail("!p || Py_REFCNT(python::upcast<PyObject>(p)) > 0",
                    "/usr/include/boost/python/refcount.hpp",0x25,
                    "void boost::python::xdecref(T *) [T = _object]");
    }
    lVar1 = local_b8->ob_refcnt + -1;
    local_b8->ob_refcnt = lVar1;
    if (lVar1 == 0) {
      _Py_Dealloc();
    }
  }
  (local_c0.m_ptr)->ob_refcnt = (local_c0.m_ptr)->ob_refcnt + 1;
  local_b8 = local_c0.m_ptr;
  local_b0 = "stderr";
  boost::python::api::getattr((object *)&local_c8,(char *)&local_b8);
  if (0 < local_b8->ob_refcnt) {
    lVar1 = local_b8->ob_refcnt + -1;
    local_b8->ob_refcnt = lVar1;
    if (lVar1 == 0) {
      _Py_Dealloc();
    }
    (local_c8.m_ptr)->ob_refcnt = (local_c8.m_ptr)->ob_refcnt + 1;
    local_50 = local_c8.m_ptr;
    local_48 = "getvalue";
    boost::python::api::
    object_operators<boost::python::api::proxy<boost::python::api::attribute_policies>_>::operator()
              ((object_operators<boost::python::api::proxy<boost::python::api::attribute_policies>_>
                *)&local_d0);
    local_b8 = local_d0;
    local_a8 = (rvalue_from_python_stage1_data)
               boost::python::converter::rvalue_from_python_stage1
                         (local_d0,boost::python::converter::detail::
                                   registered_base<std::__cxx11::string_const_volatile&>::converters
                         );
    pplVar2 = local_98;
    if ((long **)local_a8.convertible != local_98) {
      pplVar2 = (long **)boost::python::converter::rvalue_from_python_stage2
                                   (local_b8,&local_a8,
                                    boost::python::converter::detail::
                                    registered_base<std::__cxx11::string_const_volatile&>::
                                    converters);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*pplVar2,(long)pplVar2[1] + (long)*pplVar2);
    if (((long **)local_a8.convertible == local_98) && (local_98[0] != local_88)) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if (0 < local_d0->ob_refcnt) {
      lVar1 = local_d0->ob_refcnt + -1;
      local_d0->ob_refcnt = lVar1;
      if (lVar1 == 0) {
        _Py_Dealloc();
      }
      if (0 < local_50->ob_refcnt) {
        lVar1 = local_50->ob_refcnt + -1;
        local_50->ob_refcnt = lVar1;
        if (lVar1 == 0) {
          _Py_Dealloc();
        }
        this = logger::operator<<(&local_40,&local_70);
        logger::operator<<(this,(char (*) [2])0x10f034);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (0 < (local_c8.m_ptr)->ob_refcnt) {
          lVar1 = (local_c8.m_ptr)->ob_refcnt + -1;
          (local_c8.m_ptr)->ob_refcnt = lVar1;
          if (lVar1 == 0) {
            _Py_Dealloc();
          }
          if (0 < (local_c0.m_ptr)->ob_refcnt) {
            lVar1 = (local_c0.m_ptr)->ob_refcnt + -1;
            (local_c0.m_ptr)->ob_refcnt = lVar1;
            if (lVar1 == 0) {
              _Py_Dealloc();
            }
            PyErr_Clear();
            boost::recursive_mutex::~recursive_mutex(&local_40.cout_guard);
            return;
          }
        }
      }
    }
  }
  __assert_fail("Py_REFCNT(m_ptr) > 0","/usr/include/boost/python/object_core.hpp",0x1a6,
                "boost::python::api::object_base::~object_base()");
}

Assistant:

void print_py_error() {
    logger safe_cout;
	try {
		PyErr_Print();
		bp::object sys(bp::handle<>(PyImport_ImportModule("sys")));
		bp::object err = sys.attr("stderr");
		std::string err_text = bp::extract<std::string>(err.attr("getvalue")());
		safe_cout << err_text << "\n";
	} catch (...) {
		safe_cout << "Failed to parse python error\n";
	}
	PyErr_Clear();
}